

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmdynfunc.cpp
# Opt level: O0

CVmHashEntry * __thiscall CVmDynFuncMacros::find(CVmDynFuncMacros *this,char *sym,size_t len)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  vm_obj_id_t obj;
  int iVar3;
  int iVar4;
  uint uVar5;
  char *pcVar6;
  size_t sVar7;
  char *pcVar8;
  ulong uVar9;
  _func_int **pp_Var10;
  CVmHashEntry *pCVar11;
  CVmHashTable *this_00;
  char **argv_00;
  uint uVar12;
  undefined8 in_RDX;
  undefined8 in_RSI;
  size_t *in_RDI;
  char *n;
  int i;
  size_t *argvlen;
  char **argv;
  int argc;
  uint flags;
  char *arglst;
  char *exp;
  vm_val_t subele;
  vm_val_t ele;
  char *lst;
  vm_val_t symval;
  vm_val_t symstr;
  CVmHashEntry *entry;
  undefined4 in_stack_fffffffffffffea8;
  undefined4 in_stack_fffffffffffffeac;
  vm_val_t *in_stack_fffffffffffffeb0;
  vm_val_t *in_stack_fffffffffffffeb8;
  CVmHashEntry *entry_00;
  vm_val_t *in_stack_fffffffffffffec0;
  CVmHashTable *in_stack_fffffffffffffec8;
  CVmObject *in_stack_fffffffffffffed0;
  undefined4 in_stack_ffffffffffffff00;
  CTcHashEntryPpDefine *this_01;
  char *in_stack_ffffffffffffff38;
  size_t in_stack_ffffffffffffff40;
  int local_ac;
  CVmHashEntry *local_a8;
  CTcHashEntryPpDefine *local_a0;
  vm_val_t local_58;
  vm_val_t local_48;
  CVmHashEntry *local_38;
  undefined8 local_30;
  undefined8 local_28;
  CVmHashEntry *local_18;
  
  local_30 = in_RDX;
  local_28 = in_RSI;
  local_38 = CVmHashTable::find(in_stack_fffffffffffffec8,(char *)in_stack_fffffffffffffec0,
                                (size_t)in_stack_fffffffffffffeb8);
  local_18 = local_38;
  if (local_38 == (CVmHashEntry *)0x0) {
    if ((int)in_RDI[2] == 0) {
      local_18 = (CVmHashEntry *)0x0;
    }
    else {
      obj = CVmObjString::create
                      ((int)((ulong)in_stack_fffffffffffffec0 >> 0x20),
                       (char *)in_stack_fffffffffffffeb8,(size_t)in_stack_fffffffffffffeb0);
      vm_val_t::set_obj(&local_48,obj);
      CVmStack::push(&local_48);
      vm_objp(0);
      CVmObject::index_val_ov
                (in_stack_fffffffffffffed0,(vm_val_t *)in_stack_fffffffffffffec8,
                 (vm_obj_id_t)((ulong)in_stack_fffffffffffffec0 >> 0x20),in_stack_fffffffffffffeb8);
      CVmStack::push(&local_58);
      pcVar6 = vm_val_t::get_as_list
                         ((vm_val_t *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8))
      ;
      if ((pcVar6 != (char *)0x0) && (sVar7 = vmb_get_len((char *)0x331ac6), 2 < sVar7)) {
        local_a0 = (CTcHashEntryPpDefine *)0x0;
        local_a8 = (CVmHashEntry *)0x0;
        CVmObjList::index_list
                  (in_stack_fffffffffffffec0,(char *)in_stack_fffffffffffffeb8,
                   (uint)((ulong)in_stack_fffffffffffffeb0 >> 0x20));
        pcVar6 = vm_val_t::get_as_string
                           ((vm_val_t *)
                            CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
        if (pcVar6 != (char *)0x0) {
          CVmObjList::index_list
                    (in_stack_fffffffffffffec0,(char *)in_stack_fffffffffffffeb8,
                     (uint)((ulong)in_stack_fffffffffffffeb0 >> 0x20));
          pcVar8 = vm_val_t::get_as_list
                             ((vm_val_t *)
                              CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
          if (pcVar8 != (char *)0x0) {
            sVar7 = vmb_get_len((char *)0x331b74);
            iVar3 = (int)sVar7;
            if (iVar3 != 0) {
              auVar1._8_8_ = 0;
              auVar1._0_8_ = (long)iVar3;
              uVar9 = SUB168(auVar1 * ZEXT816(8),0);
              if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
                uVar9 = 0xffffffffffffffff;
              }
              local_a0 = (CTcHashEntryPpDefine *)operator_new__(uVar9);
              auVar2._8_8_ = 0;
              auVar2._0_8_ = (long)iVar3;
              uVar9 = SUB168(auVar2 * ZEXT816(8),0);
              if (SUB168(auVar2 * ZEXT816(8),8) != 0) {
                uVar9 = 0xffffffffffffffff;
              }
              local_a8 = (CVmHashEntry *)operator_new__(uVar9);
              for (local_ac = 0; local_ac < iVar3; local_ac = local_ac + 1) {
                CVmObjList::index_list
                          (in_stack_fffffffffffffec0,(char *)in_stack_fffffffffffffeb8,
                           (uint)((ulong)in_stack_fffffffffffffeb0 >> 0x20));
                pcVar8 = vm_val_t::get_as_string
                                   ((vm_val_t *)
                                    CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
                if (pcVar8 == (char *)0x0) goto LAB_00331df4;
                (&(local_a0->super_CTcHashEntryPp).super_CVmHashEntryCS.super_CVmHashEntry.
                  _vptr_CVmHashEntry)[local_ac] = (_func_int **)(pcVar8 + 2);
                pp_Var10 = (_func_int **)vmb_get_len((char *)0x331c7b);
                (&local_a8->_vptr_CVmHashEntry)[local_ac] = pp_Var10;
              }
            }
            CVmObjList::index_list
                      (in_stack_fffffffffffffec0,(char *)in_stack_fffffffffffffeb8,
                       (uint)((ulong)in_stack_fffffffffffffeb0 >> 0x20));
            iVar4 = vm_val_t::is_numeric(in_stack_fffffffffffffeb0);
            if (iVar4 != 0) {
              uVar5 = vm_val_t::num_to_int(in_stack_fffffffffffffeb0);
              pCVar11 = (CVmHashEntry *)operator_new(0x68);
              uVar12 = uVar5 & 1;
              uVar5 = (uVar5 & 2) >> 1;
              this_00 = (CVmHashTable *)(pcVar6 + 2);
              this_01 = local_a0;
              argv_00 = (char **)vmb_get_len((char *)0x331d6f);
              entry_00 = local_a8;
              CTcHashEntryPpDefine::CTcHashEntryPpDefine
                        (this_01,(textchar_t *)CONCAT44(uVar5,iVar3),
                         CONCAT44(uVar12,in_stack_ffffffffffffff00),(int)((ulong)local_30 >> 0x20),
                         (int)local_30,local_28._4_4_,(int)this_00,argv_00,in_RDI,
                         in_stack_ffffffffffffff38,in_stack_ffffffffffffff40);
              local_38 = pCVar11;
              CVmHashTable::add(this_00,entry_00);
            }
          }
        }
LAB_00331df4:
        if ((local_a0 != (CTcHashEntryPpDefine *)0x0) && (local_a0 != (CTcHashEntryPpDefine *)0x0))
        {
          operator_delete__(local_a0);
        }
        if ((local_a8 != (CVmHashEntry *)0x0) && (local_a8 != (CVmHashEntry *)0x0)) {
          operator_delete__(local_a8);
        }
      }
      CVmStack::discard(2);
      local_18 = local_38;
    }
  }
  return local_18;
}

Assistant:

CVmHashEntry *find(const char *sym, size_t len)
    {
        CVmHashEntry *entry;
        
        /* first, check to see if it's our underlying table */
        entry = hash_.find(sym, len);
        if (entry != 0)
            return entry;

        /* if there's no user-code table, fail */
        if (tab_ == VM_INVALID_OBJ)
            return 0;

        /* establish access to globals */
        VMGLOB_PTR(globals_);

        /* create a string for the symbol name; stack it for gc protection */
        vm_val_t symstr;
        symstr.set_obj(CVmObjString::create(vmg_ FALSE, sym, len));
        G_stk->push(&symstr);

        /* look up the symbol string in the table */
        vm_val_t symval;
        vm_objp(vmg_ tab_)->index_val_ov(vmg_ &symval, tab_, &symstr);
        G_stk->push(&symval);

        /* it has to be a list, and it has to have at least three elements */
        const char *lst = symval.get_as_list(vmg0_);
        if (lst != 0 && vmb_get_len(lst) >= 3)
        {
            vm_val_t ele, subele;
            const char *exp, *arglst;
            uint flags = 0;
            int argc;
            const char **argv = 0;
            size_t *argvlen = 0;
            int i;
            
            /* the first element is the expansion string */
            CVmObjList::index_list(vmg_ &ele, lst, 1);
            if ((exp = ele.get_as_string(vmg0_)) == 0)
                goto done;

            /* the second element is the argument list */
            CVmObjList::index_list(vmg_ &ele, lst, 2);
            if ((arglst = ele.get_as_list(vmg0_)) == 0)
                goto done;

            /* figure the argument count */
            argc = vmb_get_len(arglst);

            /* build the argument vector */
            if (argc != 0)
            {
                /* allocate the string and length arrays */
                argv = new const char*[argc];
                argvlen = new size_t[argc];

                /* populate the arrays */
                for (i = 0 ; i < argc ; ++i)
                {
                    /* retrieve this argument name string */
                    CVmObjList::index_list(vmg_ &subele, arglst, i+1);
                    const char *n = subele.get_as_string(vmg0_);
                    if (n == 0)
                        goto done;

                    /* add it to the string and length arrays */
                    argv[i] = n + VMB_LEN;
                    argvlen[i] = vmb_get_len(n);
                }
            }

            /* the third element is the flags */
            CVmObjList::index_list(vmg_ &ele, lst, 3);
            if (!ele.is_numeric(vmg0_))
                goto done;
            flags = ele.num_to_int(vmg0_);

            /* create the entry */
            entry = new CTcHashEntryPpDefine(
                sym, len, TRUE, (flags & 1) != 0, argc, (flags & 2) != 0,
                argv, argvlen, exp + VMB_LEN, vmb_get_len(exp));

            /* add the entry to our cache */
            hash_.add(entry);

        done:
            /* free the argument list */
            if (argv != 0)
                delete [] argv;
            if (argvlen != 0)
                delete [] argvlen;
        }

        /* done with our gc protection */
        G_stk->discard(2);

        /* return what we found */
        return entry;
    }